

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O1

bool __thiscall
covenant::CycleBreaking<covenant::Sym>::isLLRule
          (CycleBreaking<covenant::Sym> *this,CFG *g,uint lhs,
          vector<covenant::Sym,_std::allocator<covenant::Sym>_> *rhs,
          set<int,_std::less<int>,_std::allocator<int>_> *scc)

{
  Sym *pSVar1;
  bool bVar2;
  Sym *pSVar3;
  bool bVar4;
  
  pSVar3 = (rhs->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pSVar1 = (rhs->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  bVar4 = true;
  if (pSVar3 != pSVar1) {
    bVar4 = pSVar3 + 1 == pSVar1;
    if (!bVar4) {
      bVar2 = isTerminal(this,pSVar3 + 1,scc);
      if (bVar2) {
        pSVar3 = pSVar3 + 2;
        do {
          bVar4 = pSVar3 == pSVar1;
          if (bVar4) break;
          bVar2 = isTerminal(this,pSVar3,scc);
          pSVar3 = pSVar3 + 1;
        } while (bVar2);
      }
    }
    if (bVar4) {
      pSVar3 = (rhs->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar4 = true;
      if (pSVar3->x != lhs * 2 + 1) {
        bVar4 = isTerminal(this,pSVar3,scc);
        return bVar4;
      }
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool isLLRule (const CFG &g, unsigned int lhs, const vector<EdgeSym> &rhs, 
                 const set<int> &scc)
  {
    if (rhs.empty()) 
      return true;
    if (allTerminal(rhs.begin()+1, rhs.end(), scc))
      return ((rhs[0] == EdgeSym::mkVar(lhs)) || isTerminal(rhs[0],scc));
    else
      return false;
  }